

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::ImageCopyFromImage::submit
          (ImageCopyFromImage *this,SubmitContext *context)

{
  DeviceInterface *pDVar1;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_18;
  
  pDVar1 = context->m_context->m_context->m_vkd;
  local_58 = 1;
  uStack_50 = 0x100000000;
  local_48 = 0;
  uStack_40 = 0x100000000;
  local_38 = 0;
  uStack_34 = 0;
  uStack_30 = 1;
  uStack_2c = 0;
  local_28 = 0;
  local_20._0_4_ = this->m_imageWidth;
  local_20._4_4_ = this->m_imageHeight;
  local_18 = 1;
  (*pDVar1->_vptr_DeviceInterface[0x60])
            (pDVar1,context->m_commandBuffer,
             (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,
             (context->m_context->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
             m_data.object.m_internal,(ulong)this->m_imageLayout,1,&local_58);
  return;
}

Assistant:

void ImageCopyFromImage::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();
	const vk::VkImageCopy		region			=
	{
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{ 0, 0, 0 },

		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{ 0, 0, 0 },
		{
			(deUint32)m_imageWidth,
			(deUint32)m_imageHeight,
			1u
		}
	};

	vkd.cmdCopyImage(commandBuffer, *m_srcImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, context.getImage(), m_imageLayout, 1, &region);
}